

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckOfBuildinigUnitTiles.cpp
# Opt level: O3

void __thiscall
DeckOfBuildingUnitTiles::flipTile(DeckOfBuildingUnitTiles *this,BuildingUnitTiles *tile)

{
  Units UVar1;
  int iVar2;
  
  UVar1 = BuildingUnitTiles::getUnit(tile);
  if (UVar1 < (Tank|Jet)) {
    BuildingUnitTiles::setRewardType(tile,*(Rewards *)(&DAT_0011cbcc + (ulong)UVar1 * 4));
  }
  iVar2 = BuildingUnitTiles::getDurability(tile);
  BuildingUnitTiles::setDurability(tile,iVar2 + 1);
  BuildingUnitTiles::setIsUnit(tile,true);
  return;
}

Assistant:

void DeckOfBuildingUnitTiles::flipTile(BuildingUnitTiles *tile) {
    switch (tile->getUnit()) {
        case BuildingUnitTiles::Infantry: tile->setRewardType(BuildingUnitTiles::Heart); break;
        case BuildingUnitTiles::Jet: tile->setRewardType(BuildingUnitTiles::Energy); break;
        case BuildingUnitTiles::Tank: tile->setRewardType(BuildingUnitTiles::Star); break;
    }

    tile->setDurability(tile->getDurability()+1);
    tile->setIsUnit(true);
}